

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O0

int Mvc_CoverSupportSizeBinary(Mvc_Cover_t *pCover)

{
  Mvc_Cube_t *pSupp_00;
  int v1;
  int v0;
  int i;
  int Counter;
  Mvc_Cube_t *pSupp;
  Mvc_Cover_t *pCover_local;
  
  pSupp_00 = Mvc_CubeAlloc(pCover);
  Mvc_CoverSupportAnd(pCover,pSupp_00);
  v0 = pCover->nBits / 2;
  for (v1 = 0; v1 < pCover->nBits / 2; v1 = v1 + 1) {
    if (((pSupp_00->pData[(v1 << 1) >> 5] & 1 << ((byte)(v1 << 1) & 0x1f)) != 0) &&
       ((pSupp_00->pData[v1 * 2 + 1 >> 5] & 1 << ((char)v1 * '\x02' + 1U & 0x1f)) != 0)) {
      v0 = v0 + -1;
    }
  }
  Mvc_CubeFree(pCover,pSupp_00);
  return v0;
}

Assistant:

int Mvc_CoverSupportSizeBinary( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pSupp;
    int Counter, i, v0, v1;
    // compute the support
    pSupp = Mvc_CubeAlloc( pCover );
    Mvc_CoverSupportAnd( pCover, pSupp );
    Counter = pCover->nBits/2;
    for ( i = 0; i < pCover->nBits/2; i++ )
    {
        v0 = Mvc_CubeBitValue( pSupp, 2*i   );
        v1 = Mvc_CubeBitValue( pSupp, 2*i+1 );
        if ( v0 && v1 )
            Counter--;
    }
    Mvc_CubeFree( pCover, pSupp );
    return Counter;
}